

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypspur-interpreter.c
# Opt level: O3

int proc_spur(char *line,int *coordinate)

{
  int iVar1;
  char *line_00;
  char *toksave;
  char *pcStack_28;
  
  line_00 = strtok_r(line,";\n\r",&pcStack_28);
  if (line_00 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    do {
      iVar1 = proc_spur_cmd(line_00,coordinate);
      if (iVar1 < 0) {
        return -1;
      }
      line_00 = strtok_r((char *)0x0,";\n\r",&pcStack_28);
    } while (line_00 != (char *)0x0);
  }
  return iVar1;
}

Assistant:

int proc_spur(char* line, int* coordinate)
{
  char* line_div;
  char* toksave;
  int ret;

  ret = 0;
  line_div = strtok_r(line, ";\n\r", &toksave);
  while (line_div)
  {
    ret = proc_spur_cmd(line_div, coordinate);
    if (ret < 0)
    {
      break;
    }
    line_div = strtok_r(NULL, ";\n\r", &toksave);
  }
  return ret;
}